

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O3

void __thiscall Catch::SectionTracking::TestCaseTracker::leaveSection(TestCaseTracker *this)

{
  TrackedSection *pTVar1;
  _Rb_tree_node_base *p_Var2;
  RunState RVar3;
  
  pTVar1 = this->m_currentSection;
  p_Var2 = (pTVar1->m_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  RVar3 = Completed;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(pTVar1->m_children)._M_t._M_impl.super__Rb_tree_header) {
LAB_00141e71:
      pTVar1->m_runState = RVar3;
      pTVar1 = pTVar1->m_parent;
      this->m_currentSection = pTVar1;
      if (pTVar1 != (TrackedSection *)0x0) {
        this->m_completedASectionThisRun = true;
        return;
      }
      __assert_fail("m_currentSection != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/I3ck[P]LazyTrees/tests/../dependencies/Catch.h"
                    ,0x1308,"void Catch::SectionTracking::TestCaseTracker::leaveSection()");
    }
    if (p_Var2[3]._M_color != 3) {
      RVar3 = ExecutingChildren;
      goto LAB_00141e71;
    }
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

void leaveSection() {
            m_currentSection->leave();
            m_currentSection = m_currentSection->getParent();
            assert( m_currentSection != NULL );
            m_completedASectionThisRun = true;
        }